

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks_connecter.cpp
# Opt level: O0

int __thiscall zmq::socks_connecter_t::connect_to_proxy(socks_connecter_t *this)

{
  bool bVar1;
  fd_t fVar2;
  socklen_t sVar3;
  int iVar4;
  void *pvVar5;
  sockaddr *psVar6;
  int *piVar7;
  stream_connecter_base_t *in_RDI;
  int rc;
  tcp_address_t *tcp_addr;
  tcp_address_t *in_stack_ffffffffffffff80;
  fd_t s_;
  undefined4 in_stack_ffffffffffffff8c;
  undefined2 uVar8;
  options_t *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  void *local_58;
  int local_4;
  
  uVar8 = (undefined2)((uint)in_stack_ffffffffffffff8c >> 0x10);
  if (in_RDI->_s != -1) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_s == retired_fd",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks_connecter.cpp"
            ,0x116);
    fflush(_stderr);
    zmq_abort((char *)0x238314);
  }
  if (((in_RDI[1]._addr)->resolved).dummy != (void *)0x0) {
    pvVar5 = ((in_RDI[1]._addr)->resolved).dummy;
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,0x3c);
    }
    ((in_RDI[1]._addr)->resolved).dummy = (void *)0x0;
  }
  pvVar5 = operator_new(0x3c,(nothrow_t *)&std::nothrow);
  local_58 = (void *)0x0;
  if (pvVar5 != (void *)0x0) {
    tcp_address_t::tcp_address_t(in_stack_ffffffffffffff80);
    local_58 = pvVar5;
  }
  ((in_RDI[1]._addr)->resolved).dummy = local_58;
  if (((in_RDI[1]._addr)->resolved).dummy == (void *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks_connecter.cpp"
            ,0x11e);
    fflush(_stderr);
    zmq_abort((char *)0x238424);
  }
  std::__cxx11::string::c_str();
  fVar2 = tcp_open_socket(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                          SUB21((ushort)uVar8 >> 8,0),SUB21(uVar8,0),in_stack_ffffffffffffff80);
  s_ = (fd_t)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  in_RDI->_s = fVar2;
  if (in_RDI->_s == -1) {
    pvVar5 = ((in_RDI[1]._addr)->resolved).dummy;
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,0x3c);
    }
    ((in_RDI[1]._addr)->resolved).dummy = (void *)0x0;
    local_4 = -1;
  }
  else {
    if (((in_RDI[1]._addr)->resolved).dummy == (void *)0x0) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_proxy_addr->resolved.tcp_addr != NULL",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socks_connecter.cpp"
              ,0x129);
      fflush(_stderr);
      zmq_abort((char *)0x238556);
    }
    unblock_socket(s_);
    bVar1 = tcp_address_t::has_src_addr(((in_RDI[1]._addr)->resolved).tcp_addr);
    if (bVar1) {
      fVar2 = in_RDI->_s;
      psVar6 = tcp_address_t::src_addr((tcp_address_t *)0x2385a6);
      sVar3 = tcp_address_t::src_addrlen((tcp_address_t *)0x2385b5);
      iVar4 = bind(fVar2,(sockaddr *)psVar6,sVar3);
      if (iVar4 == -1) {
        stream_connecter_base_t::close(in_RDI,(int)psVar6);
        return -1;
      }
    }
    iVar4 = in_RDI->_s;
    psVar6 = tcp_address_t::addr((tcp_address_t *)0x238602);
    sVar3 = tcp_address_t::addrlen((tcp_address_t *)0x238611);
    iVar4 = connect(iVar4,(sockaddr *)psVar6,sVar3);
    if (iVar4 == 0) {
      local_4 = 0;
    }
    else {
      piVar7 = __errno_location();
      if (*piVar7 == 4) {
        piVar7 = __errno_location();
        *piVar7 = 0x73;
      }
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int zmq::socks_connecter_t::connect_to_proxy ()
{
    zmq_assert (_s == retired_fd);

    //  Resolve the address
    if (_proxy_addr->resolved.tcp_addr != NULL) {
        LIBZMQ_DELETE (_proxy_addr->resolved.tcp_addr);
    }

    _proxy_addr->resolved.tcp_addr = new (std::nothrow) tcp_address_t ();
    alloc_assert (_proxy_addr->resolved.tcp_addr);
    //  Automatic fallback to ipv4 is disabled here since this was the existing
    //  behaviour, however I don't see a real reason for this. Maybe this can
    //  be changed to true (and then the parameter can be removed entirely).
    _s = tcp_open_socket (_proxy_addr->address.c_str (), options, false, false,
                          _proxy_addr->resolved.tcp_addr);
    if (_s == retired_fd) {
        //  TODO we should emit some event in this case!
        LIBZMQ_DELETE (_proxy_addr->resolved.tcp_addr);
        return -1;
    }
    zmq_assert (_proxy_addr->resolved.tcp_addr != NULL);

    // Set the socket to non-blocking mode so that we get async connect().
    unblock_socket (_s);

    const tcp_address_t *const tcp_addr = _proxy_addr->resolved.tcp_addr;

    int rc;

    // Set a source address for conversations
    if (tcp_addr->has_src_addr ()) {
#if defined ZMQ_HAVE_VXWORKS
        rc = ::bind (_s, (sockaddr *) tcp_addr->src_addr (),
                     tcp_addr->src_addrlen ());
#else
        rc = ::bind (_s, tcp_addr->src_addr (), tcp_addr->src_addrlen ());
#endif
        if (rc == -1) {
            close ();
            return -1;
        }
    }

    //  Connect to the remote peer.
#if defined ZMQ_HAVE_VXWORKS
    rc = ::connect (_s, (sockaddr *) tcp_addr->addr (), tcp_addr->addrlen ());
#else
    rc = ::connect (_s, tcp_addr->addr (), tcp_addr->addrlen ());
#endif
    //  Connect was successful immediately.
    if (rc == 0)
        return 0;

        //  Translate error codes indicating asynchronous connect has been
        //  launched to a uniform EINPROGRESS.
#ifdef ZMQ_HAVE_WINDOWS
    const int last_error = WSAGetLastError ();
    if (last_error == WSAEINPROGRESS || last_error == WSAEWOULDBLOCK)
        errno = EINPROGRESS;
    else {
        errno = wsa_error_to_errno (last_error);
        close ();
    }
#else
    if (errno == EINTR)
        errno = EINPROGRESS;
#endif
    return -1;
}